

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

ImGuiColumns * ImGui::FindOrCreateColumns(ImGuiWindow *window,ImGuiID id)

{
  undefined8 uVar1;
  int iVar2;
  ulong uVar3;
  ImGuiColumns *in_RAX;
  ImGuiColumns *pIVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ImGuiColumns *pIVar10;
  bool bVar11;
  byte bVar12;
  ImGuiColumns IStack_98;
  
  bVar12 = 0;
  uVar6 = (ulong)(window->ColumnsStorage).Size;
  bVar11 = 0 < (long)uVar6;
  if ((0 < (long)uVar6) && (in_RAX = (window->ColumnsStorage).Data, in_RAX->ID != id)) {
    uVar3 = 1;
    do {
      uVar8 = uVar3;
      if (uVar6 == uVar8) {
        bVar11 = uVar8 < uVar6;
        goto LAB_00180a99;
      }
      pIVar10 = in_RAX + 1;
      pIVar4 = in_RAX + 1;
      in_RAX = pIVar10;
      uVar3 = uVar8 + 1;
    } while (pIVar4->ID != id);
    bVar11 = uVar8 < uVar6;
  }
LAB_00180a99:
  if (!bVar11) {
    ImGuiColumns::ImGuiColumns(&IStack_98);
    iVar9 = (window->ColumnsStorage).Size;
    iVar2 = (window->ColumnsStorage).Capacity;
    if (iVar9 == iVar2) {
      iVar9 = iVar9 + 1;
      if (iVar2 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar2 / 2 + iVar2;
      }
      if (iVar9 < iVar5) {
        iVar9 = iVar5;
      }
      if (iVar2 < iVar9) {
        pIVar4 = (ImGuiColumns *)MemAlloc((long)iVar9 * 0x78);
        pIVar10 = (window->ColumnsStorage).Data;
        if (pIVar10 != (ImGuiColumns *)0x0) {
          memcpy(pIVar4,pIVar10,(long)(window->ColumnsStorage).Size * 0x78);
          MemFree((window->ColumnsStorage).Data);
        }
        (window->ColumnsStorage).Data = pIVar4;
        (window->ColumnsStorage).Capacity = iVar9;
      }
    }
    pIVar10 = &IStack_98;
    pIVar4 = (window->ColumnsStorage).Data + (window->ColumnsStorage).Size;
    for (lVar7 = 0xf; lVar7 != 0; lVar7 = lVar7 + -1) {
      uVar1 = *(undefined8 *)pIVar10;
      pIVar4->ID = (int)uVar1;
      pIVar4->Flags = (int)((ulong)uVar1 >> 0x20);
      pIVar10 = (ImGuiColumns *)((long)pIVar10 + ((ulong)bVar12 * -2 + 1) * 8);
      pIVar4 = (ImGuiColumns *)((long)pIVar4 + (ulong)bVar12 * -0x10 + 8);
    }
    (window->ColumnsStorage).Size = (window->ColumnsStorage).Size + 1;
    ImDrawListSplitter::ClearFreeMemory(&IStack_98.Splitter);
    if (IStack_98.Splitter._Channels.Data != (ImDrawChannel *)0x0) {
      MemFree(IStack_98.Splitter._Channels.Data);
    }
    if (IStack_98.Columns.Data != (ImGuiColumnData *)0x0) {
      MemFree(IStack_98.Columns.Data);
    }
    lVar7 = (long)(window->ColumnsStorage).Size;
    if (lVar7 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                    ,0x538,"T &ImVector<ImGuiColumns>::back() [T = ImGuiColumns]");
    }
    in_RAX = (window->ColumnsStorage).Data + lVar7 + -1;
    in_RAX->ID = id;
  }
  return in_RAX;
}

Assistant:

ImGuiColumns* ImGui::FindOrCreateColumns(ImGuiWindow* window, ImGuiID id)
{
    // We have few columns per window so for now we don't need bother much with turning this into a faster lookup.
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiColumns());
    ImGuiColumns* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}